

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

TabularCPT * __thiscall
despot::Parser::CreateTabularObsFunction(Parser *this,TiXmlElement *e_CondProb)

{
  TiXmlElement *pTVar1;
  pointer pNVar2;
  _func_int **pp_Var3;
  pointer pdVar4;
  bool bVar5;
  bool condition;
  int iVar6;
  int iVar7;
  TiXmlElement *pTVar8;
  char *pcVar9;
  long *plVar10;
  TiXmlNode *pTVar11;
  mapped_type *ppVVar12;
  TiXmlElement *pTVar13;
  size_type *psVar14;
  pointer pTVar15;
  NamedVar **ppNVar16;
  long lVar17;
  TiXmlElement *pTVar18;
  pointer pNVar19;
  Parser *this_00;
  long lVar20;
  ulong uVar21;
  string parent_name;
  vector<double,_std::allocator<double>_> values;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_tokens;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> parents;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parent_names;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  instance;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  TabularCPT *local_280;
  TiXmlElement *local_278;
  Parser *local_270;
  vector<double,_std::allocator<double>_> local_268;
  pointer local_248;
  pointer local_240;
  pointer local_238;
  undefined1 local_230 [40];
  undefined1 local_208 [32];
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  undefined1 local_1b8 [24];
  pointer local_1a0;
  NamedVar *local_198;
  pointer pvStack_190;
  string local_188;
  string local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  string local_130;
  string local_110;
  string local_f0;
  vector<despot::NamedVar,_std::allocator<despot::NamedVar>_> *local_d0;
  vector<despot::StateVar,_std::allocator<despot::StateVar>_> *local_c8;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_c0;
  undefined1 local_a8 [32];
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_278 = e_CondProb;
  pTVar8 = util::tinyxml::TiXmlNode::FirstChildElement(&e_CondProb->super_TiXmlNode,"Var");
  pcVar9 = util::tinyxml::TiXmlElement::GetText(pTVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,pcVar9,(allocator<char> *)local_2c0);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_68._M_dataplus._M_p,
             local_68._M_dataplus._M_p + local_68._M_string_length);
  bVar5 = Variable::IsVariableName(&local_88,&this->obs_vars_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
                 "In <ObsFunction>: Variable ",&local_68);
  plVar10 = (long *)std::__cxx11::string::append(local_2c0);
  psVar14 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_f0.field_2._M_allocated_capacity = *psVar14;
    local_f0.field_2._8_8_ = plVar10[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar14;
    local_f0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_f0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  pTVar11 = util::tinyxml::TiXmlNode::FirstChild(&local_278->super_TiXmlNode,"Var");
  Ensure(this,bVar5,&local_f0,&pTVar11->super_TiXmlBase);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_280 = (TabularCPT *)&this->variables_;
  ppVVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                           *)local_280,&local_68);
  local_248 = (pointer)*ppVVar12;
  local_1e8.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar8 = util::tinyxml::TiXmlNode::FirstChildElement(&local_278->super_TiXmlNode,"Parent");
  pcVar9 = util::tinyxml::TiXmlElement::GetText(pTVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2c0,pcVar9,(allocator<char> *)local_2a0);
  local_2a0._0_8_ = (TiXmlElement *)(local_2a0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0," ","");
  Tokenize(&local_148,(string *)local_2c0,(string *)local_2a0);
  if ((TiXmlElement *)local_2a0._0_8_ != (TiXmlElement *)(local_2a0 + 0x10)) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  local_270 = this;
  if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  if (local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_c8 = &local_270->curr_state_vars_;
    local_d0 = &local_270->action_vars_;
    lVar17 = 8;
    uVar21 = 0;
    do {
      local_2c0._0_8_ = local_2c0 + 0x10;
      lVar20 = *(long *)((long)local_148.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar17 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2c0,lVar20,
                 *(long *)((long)&((local_148.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar17) + lVar20);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,local_2c0._0_8_,(pointer)(local_2c0._0_8_ + local_2c0._8_8_));
      bVar5 = Variable::IsVariableName(&local_110,local_c8);
      condition = true;
      if (!bVar5) {
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_168,local_2c0._0_8_,(pointer)(local_2c0._0_8_ + local_2c0._8_8_)
                  );
        condition = Variable::IsVariableName(&local_168,local_d0);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                     "In <ObsFunction>: Parent ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0)
      ;
      plVar10 = (long *)std::__cxx11::string::append((char *)local_2a0);
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      psVar14 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_188.field_2._M_allocated_capacity = *psVar14;
        local_188.field_2._8_8_ = plVar10[3];
      }
      else {
        local_188.field_2._M_allocated_capacity = *psVar14;
        local_188._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_188._M_string_length = plVar10[1];
      *plVar10 = (long)psVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      pTVar11 = util::tinyxml::TiXmlNode::FirstChild(&local_278->super_TiXmlNode,"Parent");
      Ensure(local_270,condition,&local_188,&pTVar11->super_TiXmlBase);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((TiXmlElement *)local_2a0._0_8_ != (TiXmlElement *)(local_2a0 + 0x10)) {
        operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
      }
      if ((!bVar5) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2)) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      ppVVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                               *)local_280,(key_type *)local_2c0);
      local_2a0._0_8_ = *ppVVar12;
      std::vector<despot::NamedVar*,std::allocator<despot::NamedVar*>>::
      emplace_back<despot::NamedVar*>
                ((vector<despot::NamedVar*,std::allocator<despot::NamedVar*>> *)&local_1e8,
                 (NamedVar **)local_2a0);
      if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      uVar21 = uVar21 + 1;
      lVar17 = lVar17 + 0x20;
    } while (uVar21 < (ulong)((long)local_148.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_148.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  local_280 = (TabularCPT *)operator_new(0x70);
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector(&local_c0,&local_1e8)
  ;
  TabularCPT::TabularCPT(local_280,&local_248->super_NamedVar,&local_c0);
  if ((_Elt_pointer)
      local_c0.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pTVar8 = GetParameterElement(local_270,local_278);
  pTVar8 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar8->super_TiXmlNode,"Entry");
  if (pTVar8 != (TiXmlElement *)0x0) {
    do {
      pTVar18 = (TiXmlElement *)(local_2a0 + 0x10);
      pTVar13 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar8->super_TiXmlNode,"Instance");
      pcVar9 = util::tinyxml::TiXmlElement::GetText(pTVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2c0,pcVar9,(allocator<char> *)local_2a0);
      local_2a0._0_8_ = pTVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0," ","");
      Tokenize(&local_48,(string *)local_2c0,(string *)local_2a0);
      if ((TiXmlElement *)local_2a0._0_8_ != pTVar18) {
        operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
      }
      if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pTVar13 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar8->super_TiXmlNode,"ProbTable");
      pcVar9 = util::tinyxml::TiXmlElement::GetText(pTVar13);
      this_00 = (Parser *)local_2c0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)this_00,pcVar9,(allocator<char> *)local_2a0);
      iVar6 = ComputeNumOfEntries(this_00,&local_48,&local_1e8,&local_248->super_NamedVar);
      iVar7 = std::__cxx11::string::compare(local_2c0);
      if (iVar7 == 0) {
        if (0 < iVar6) {
          local_278 = (TiXmlElement *)
                      (1.0 / (double)(int)((ulong)((long)(local_248->super_NamedVar).super_Variable.
                                                         values_.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(local_248->super_NamedVar).super_Variable.
                                                        values_.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
          do {
            local_2a0._0_8_ = local_278;
            if (local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        (&local_268,
                         (iterator)
                         local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(double *)local_2a0);
            }
            else {
              *local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = (double)local_278;
              local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
      }
      else {
        local_2a0._0_8_ = pTVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0," ","");
        Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_230 + 0x10),(string *)local_2c0,(string *)local_2a0);
        if ((TiXmlElement *)local_2a0._0_8_ != pTVar18) {
          operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
        }
        lVar17 = local_230._24_8_ - local_230._16_8_;
        to_string<int>((string *)local_a8,iVar6);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x1771ac);
        local_1c8._M_allocated_capacity = (size_type)local_1b8;
        pTVar15 = (pointer)(plVar10 + 2);
        if ((pointer)*plVar10 == pTVar15) {
          local_1b8._0_8_ = (pTVar15->super_CPT).super_Function._vptr_Function;
          local_1b8._8_8_ = plVar10[3];
        }
        else {
          local_1b8._0_8_ = (pTVar15->super_CPT).super_Function._vptr_Function;
          local_1c8._M_allocated_capacity = (size_type)(pointer)*plVar10;
        }
        local_1c8._8_8_ = plVar10[1];
        *plVar10 = (long)pTVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append(local_1c8._M_local_buf);
        local_240 = (pointer)local_230;
        pNVar19 = (pointer)(plVar10 + 2);
        if ((pointer)*plVar10 == pNVar19) {
          local_230._0_8_ = (pNVar19->super_Variable)._vptr_Variable;
          local_230._8_8_ = plVar10[3];
        }
        else {
          local_230._0_8_ = (pNVar19->super_Variable)._vptr_Variable;
          local_240 = (pointer)*plVar10;
        }
        local_238 = (pointer)plVar10[1];
        *plVar10 = (long)pNVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        to_string<unsigned_long>
                  ((string *)local_208,(long)(local_230._24_8_ - local_230._16_8_) >> 5);
        pNVar19 = (pointer)0xf;
        if (local_240 != (pointer)local_230) {
          pNVar19 = (pointer)local_230._0_8_;
        }
        pNVar2 = (pointer)((long)&((Variable *)local_208._8_8_)->_vptr_Variable + (long)local_238);
        if (pNVar19 < pNVar2) {
          pNVar19 = (pointer)0xf;
          if ((pointer)local_208._0_8_ != (pointer)(local_208 + 0x10)) {
            pNVar19 = (pointer)local_208._16_8_;
          }
          if (pNVar19 < pNVar2) goto LAB_00152972;
          plVar10 = (long *)std::__cxx11::string::replace
                                      ((ulong)local_208,0,(char *)0x0,(ulong)local_240);
        }
        else {
LAB_00152972:
          plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_240,local_208._0_8_);
        }
        pTVar1 = (TiXmlElement *)(plVar10 + 2);
        if ((TiXmlElement *)*plVar10 == pTVar1) {
          local_2a0._16_8_ = (pTVar1->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase;
          local_2a0._24_8_ = plVar10[3];
          local_2a0._0_8_ = pTVar18;
        }
        else {
          local_2a0._16_8_ = (pTVar1->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase;
          local_2a0._0_8_ = (TiXmlElement *)*plVar10;
        }
        local_2a0._8_8_ = plVar10[1];
        *plVar10 = (long)pTVar1;
        plVar10[1] = 0;
        *(undefined1 *)&(pTVar1->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)local_2a0);
        local_1b8._16_8_ = &local_198;
        ppNVar16 = (NamedVar **)(plVar10 + 2);
        if ((NamedVar **)*plVar10 == ppNVar16) {
          local_198 = *ppNVar16;
          pvStack_190 = (pointer)plVar10[3];
        }
        else {
          local_198 = *ppNVar16;
          local_1b8._16_8_ = (NamedVar **)*plVar10;
        }
        local_1a0 = (pointer)plVar10[1];
        *plVar10 = (long)ppNVar16;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        pTVar13 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar8->super_TiXmlNode,"ProbTable");
        Ensure(local_270,lVar17 >> 5 == (long)iVar6,(string *)(local_1b8 + 0x10),
               (TiXmlBase *)pTVar13);
        if ((NamedVar **)local_1b8._16_8_ != &local_198) {
          operator_delete((void *)local_1b8._16_8_,
                          (ulong)((long)&(local_198->super_Variable)._vptr_Variable + 1));
        }
        if ((TiXmlElement *)local_2a0._0_8_ != pTVar18) {
          operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
        }
        if ((pointer)local_208._0_8_ != (pointer)(local_208 + 0x10)) {
          operator_delete((void *)local_208._0_8_,(ulong)(local_208._16_8_ + 1));
        }
        if (local_240 != (pointer)local_230) {
          operator_delete(local_240,
                          (ulong)((long)&((Variable *)local_230._0_8_)->_vptr_Variable + 1));
        }
        if ((pointer)local_1c8._M_allocated_capacity != (pointer)local_1b8) {
          operator_delete((void *)local_1c8._M_allocated_capacity,
                          (ulong)((long)&(((CPT *)local_1b8._0_8_)->super_Function)._vptr_Function +
                                 1));
        }
        if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
        }
        std::vector<double,_std::allocator<double>_>::resize
                  (&local_268,(long)(local_230._24_8_ - local_230._16_8_) >> 5);
        pdVar4 = local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_230._24_8_ - local_230._16_8_ != 0) {
          lVar20 = (long)(local_230._24_8_ - local_230._16_8_) >> 5;
          lVar17 = 0;
          pNVar19 = (pointer)local_230._16_8_;
          do {
            pp_Var3 = (_func_int **)atof((char *)(pNVar19->super_Variable)._vptr_Variable);
            (&(((NamedVar *)pdVar4)->super_Variable)._vptr_Variable)[lVar17] = pp_Var3;
            lVar17 = lVar17 + 1;
            pNVar19 = (pointer)&(pNVar19->super_Variable).index_;
          } while (lVar20 + (ulong)(lVar20 == 0) != lVar17);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_230 + 0x10));
      }
      iVar6 = (*(local_280->super_CPT).super_Function._vptr_Function[2])
                        (local_280,&local_48,&local_268);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"In <ObsFunction>: Value assignment failed.","");
      pTVar13 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar8->super_TiXmlNode,"Instance");
      Ensure(local_270,SUB41(iVar6,0),&local_130,(TiXmlBase *)pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,
                        (ulong)(local_130.field_2._M_allocated_capacity + 1));
      }
      pTVar8 = util::tinyxml::TiXmlNode::NextSiblingElement(&pTVar8->super_TiXmlNode);
      if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      if ((pointer)local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    } while (pTVar8 != (TiXmlElement *)0x0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  if ((pointer)local_1e8.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
               ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.
                    super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return local_280;
}

Assistant:

TabularCPT* Parser::CreateTabularObsFunction(TiXmlElement* e_CondProb) {
	// <Var>
	string name = GetFirstChildText(e_CondProb, "Var");

	Ensure(Variable::IsVariableName(name, obs_vars_),
		"In <ObsFunction>: Variable " + name
			+ " has not been declared as an ObsVar vname within the <Variable> tag.",
		e_CondProb->FirstChild("Var"));

	ObsVar* child = static_cast<ObsVar*>(variables_[name]);

	// <Parent>
	vector<NamedVar*> parents;
	vector<string> parent_names = Tokenize(
		GetFirstChildText(e_CondProb, "Parent"));
	for (int i = 0; i < parent_names.size(); i++) {
		string parent_name = parent_names[i];
		Ensure(
			Variable::IsVariableName(parent_name, curr_state_vars_)
				|| Variable::IsVariableName(parent_name, action_vars_),
			"In <ObsFunction>: Parent " + parent_name
				+ " has not been declared as a StateVar vnameCurr or an ActionVar vname within the <Variable> tag.",
			e_CondProb->FirstChild("Parent"));

		parents.push_back(static_cast<StateVar*>(variables_[parent_name]));
	}

	TabularCPT* func = new TabularCPT(child, parents);

	// <Parameter>
	TiXmlElement* e_Parameter = GetParameterElement(e_CondProb);
	TiXmlElement* e_Entry = e_Parameter->FirstChildElement("Entry");
	while (e_Entry != NULL) {
		// <Instance>
		vector<string> instance = Tokenize(
			GetFirstChildText(e_Entry, "Instance"));

		// <ProbTable>
		vector<double> values;
		string table = GetFirstChildText(e_Entry, "ProbTable");

		int num_entries = ComputeNumOfEntries(instance, parents, child);

		if (table == "uniform") { // keyword uniform
			int num = child->Size();
			for (int i = 0; i < num_entries; i++) {
				values.push_back(1.0 / num);
			}
		} else { // numbers
			vector<string> value_tokens = Tokenize(table);

			Ensure(num_entries == value_tokens.size(),
				"In <ObsFunction>: " + to_string(num_entries)
					+ " entries expected but " + to_string(value_tokens.size())
					+ " found.", GetFirstChildElement(e_Entry, "ProbTable"));

			values.resize(value_tokens.size());
			for (int i = 0; i < value_tokens.size(); i++) {
				values[i] = atof(value_tokens[i].c_str());
			}
		}

		bool success = func->SetValue(instance, values);

		Ensure(success, "In <ObsFunction>: Value assignment failed.",
			GetFirstChildElement(e_Entry, "Instance"));

		e_Entry = e_Entry->NextSiblingElement();
	}

	return func;
}